

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> __thiscall
duckdb::ParquetReader::CreateReader(ParquetReader *this,ClientContext *context)

{
  size_type __n;
  ParquetColumnSchema *args;
  _Head_base<0UL,_duckdb::ColumnReader_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ColumnReader_*,_false> _Var2;
  pointer pCVar3;
  StructColumnReader *pSVar4;
  reference pvVar5;
  pointer pEVar6;
  InternalException *this_00;
  ClientContext *in_RDX;
  long *plVar7;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ColumnReader_*,_false> local_78;
  _Head_base<0UL,_duckdb::ParquetColumnSchema_*,_false> local_70;
  vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
  *local_68;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_60;
  ClientContext *local_58;
  _Head_base<0UL,_duckdb::ColumnReader_*,_false> local_50 [2];
  
  unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>::
  operator*((unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
             *)(context + 0x170));
  local_58 = in_RDX;
  CreateReaderRecursive
            (this,context,(vector<duckdb::ColumnIndex,_true> *)in_RDX,
             (ParquetColumnSchema *)(context + 0x70));
  pCVar3 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                       *)this);
  if (pCVar3->column_schema->type == (LogicalType)0x64) {
    pCVar3 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
             operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                         *)this);
    pSVar4 = ColumnReader::Cast<duckdb::StructColumnReader>(pCVar3);
    plVar7 = *(long **)(context + 0xa0);
    if (plVar7 != (long *)0x0) {
      local_68 = &pSVar4->child_readers;
      do {
        __n = plVar7[1];
        pvVar5 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
                 ::operator[](local_68,__n);
        local_50[0]._M_head_impl =
             (pvVar5->
             super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>).
             _M_t.
             super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>
             .super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl;
        (pvVar5->super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
        ._M_t.
        super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
        super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl = (ColumnReader *)0x0;
        pCVar3 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
                 operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                             *)local_50);
        args = pCVar3->column_schema;
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)(plVar7 + 2));
        local_78._M_head_impl._0_4_ = 3;
        make_uniq<duckdb::ParquetColumnSchema,duckdb::ParquetColumnSchema_const&,duckdb::LogicalType&,duckdb::ParquetColumnSchemaType>
                  ((duckdb *)&local_70,args,(LogicalType *)(pEVar6 + 0x38),
                   (ParquetColumnSchemaType *)&local_78);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)(plVar7 + 2));
        (**(code **)(*(long *)pEVar6 + 0x88))(&local_60,pEVar6);
        make_uniq<duckdb::ExpressionColumnReader,duckdb::ClientContext&,duckdb::unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::ParquetColumnSchema,std::default_delete<duckdb::ParquetColumnSchema>,true>>
                  ((duckdb *)&local_78,local_58,
                   (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                    *)local_50,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_60,
                   (unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
                    *)&local_70);
        if (local_60._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)local_60._M_head_impl + 8))();
        }
        _Var2._M_head_impl = local_78._M_head_impl;
        local_78._M_head_impl = (ColumnReader *)0x0;
        pvVar5 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
                 ::operator[](local_68,__n);
        _Var1._M_head_impl =
             (pvVar5->
             super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>).
             _M_t.
             super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>
             .super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl;
        (pvVar5->super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
        ._M_t.
        super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
        super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl = _Var2._M_head_impl;
        if (_Var1._M_head_impl != (ColumnReader *)0x0) {
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_ColumnReader + 8))();
        }
        if (local_78._M_head_impl != (ColumnReader *)0x0) {
          (*(local_78._M_head_impl)->_vptr_ColumnReader[1])();
        }
        if (local_70._M_head_impl != (ParquetColumnSchema *)0x0) {
          std::default_delete<duckdb::ParquetColumnSchema>::operator()
                    ((default_delete<duckdb::ParquetColumnSchema> *)&local_70,local_70._M_head_impl)
          ;
        }
        if (local_50[0]._M_head_impl != (ColumnReader *)0x0) {
          (*(local_50[0]._M_head_impl)->_vptr_ColumnReader[1])();
        }
        plVar7 = (long *)*plVar7;
      } while (plVar7 != (long *)0x0);
    }
    return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
           (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50[0]._M_head_impl = (ColumnReader *)&stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Root element of Parquet file must be a struct","");
  duckdb::InternalException::InternalException(this_00,(string *)local_50);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ColumnReader> ParquetReader::CreateReader(ClientContext &context) {
	auto ret = CreateReaderRecursive(context, column_indexes, *root_schema);
	if (ret->Type().id() != LogicalTypeId::STRUCT) {
		throw InternalException("Root element of Parquet file must be a struct");
	}
	// add expressions if required
	auto &root_struct_reader = ret->Cast<StructColumnReader>();
	for (auto &entry : expression_map) {
		auto column_id = entry.first;
		auto &expression = entry.second;
		auto child_reader = std::move(root_struct_reader.child_readers[column_id]);
		auto expr_schema = make_uniq<ParquetColumnSchema>(child_reader->Schema(), expression->return_type,
		                                                  ParquetColumnSchemaType::EXPRESSION);
		auto expr_reader = make_uniq<ExpressionColumnReader>(context, std::move(child_reader), expression->Copy(),
		                                                     std::move(expr_schema));
		root_struct_reader.child_readers[column_id] = std::move(expr_reader);
	}
	return ret;
}